

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_rset(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ROOM_INDEX_DATA *room;
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  char local_3628 [4608];
  char local_2428 [4608];
  char local_1228 [4616];
  
  smash_tilde(argument);
  pcVar3 = one_argument(argument,local_1228);
  pcVar3 = one_argument(pcVar3,local_2428);
  strcpy(local_3628,pcVar3);
  if (((local_1228[0] == '\0') || (local_2428[0] == '\0')) || (local_3628[0] == '\0')) {
    send_to_char("Syntax:\n\r",ch);
    send_to_char("  set room <location> <field> <value>\n\r",ch);
    send_to_char("  Field being one of:\n\r",ch);
    pcVar3 = "    flags sector\n\r";
  }
  else {
    room = find_location(ch,local_1228);
    if (room == (ROOM_INDEX_DATA *)0x0) {
      pcVar3 = "No such location.\n\r";
    }
    else {
      bVar1 = is_room_owner(ch,room);
      if (((bVar1) || (ch->in_room == room)) ||
         ((bVar1 = room_is_private(room), !bVar1 || (bVar1 = is_trusted(ch,0x3c), bVar1)))) {
        bVar1 = is_number(local_3628);
        if (bVar1) {
          iVar2 = atoi(local_3628);
          bVar1 = str_prefix(local_2428,"sector");
          if (bVar1) {
            do_rset(ch,"");
            return;
          }
          room->sector_type = (short)iVar2;
          return;
        }
        pcVar3 = "Value must be numeric.\n\r";
      }
      else {
        pcVar3 = "That room is private right now.\n\r";
      }
    }
  }
  send_to_char(pcVar3,ch);
  return;
}

Assistant:

void do_rset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	ROOM_INDEX_DATA *location;
	int value;

	smash_tilde(argument);
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	strcpy(arg3, argument);

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set room <location> <field> <value>\n\r", ch);
		send_to_char("  Field being one of:\n\r", ch);
		send_to_char("    flags sector\n\r", ch);
		return;
	}

	location = find_location(ch, arg1);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	if (!is_room_owner(ch, location) && ch->in_room != location && room_is_private(location) &&
		!is_trusted(ch, IMPLEMENTOR))
	{
		send_to_char("That room is private right now.\n\r", ch);
		return;
	}

	/*
	 * Snarf the value.
	 */
	if (!is_number(arg3))
	{
		send_to_char("Value must be numeric.\n\r", ch);
		return;
	}

	value = atoi(arg3);

	/*
	 * Set something.
	 */

	if (!str_prefix(arg2, "sector"))
	{
		location->sector_type = value;
		return;
	}

	/*
	 * Generate usage message.
	 */
	do_rset(ch, "");
}